

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

bool slang::subGeneral(uint64_t *dst,uint64_t *x,uint64_t *y,uint32_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = false;
  for (uVar3 = 0; len != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = (ulong)bVar4;
    uVar2 = x[uVar3] - y[uVar3];
    bVar4 = x[uVar3] < y[uVar3] || uVar2 < uVar1;
    dst[uVar3] = uVar2 - uVar1;
  }
  return SUB41(len,0);
}

Assistant:

static bool subGeneral(uint64_t* dst, const uint64_t* x, const uint64_t* y, uint32_t len) {
    uint8_t borrow = 0;
    for (uint32_t i = 0; i < len; i++) {
        calc_out_t result;
        borrow = subborrow64(borrow, x[i], y[i], &result);
        dst[i] = result;
    }
    return borrow;
}